

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O1

void internal_zip_reconstruct_bytes(uint8_t *out,uint8_t *source,uint64_t count)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  uint8_t uVar31;
  ulong uVar32;
  uint8_t *puVar33;
  uint8_t *puVar34;
  ulong uVar35;
  uint8_t uVar36;
  
  if (1 < (long)count) {
    puVar34 = source + 1;
    uVar36 = *source;
    do {
      uVar36 = uVar36 + *puVar34 + 0x80;
      *puVar34 = uVar36;
      puVar34 = puVar34 + 1;
    } while (puVar34 < source + count);
  }
  uVar32 = count + 1 >> 1;
  if (0x1f < count) {
    uVar35 = count >> 5;
    do {
      uVar36 = *source;
      uVar1 = source[1];
      uVar2 = source[2];
      uVar3 = source[3];
      uVar4 = source[4];
      uVar5 = source[5];
      uVar6 = source[6];
      uVar7 = source[7];
      uVar8 = source[8];
      uVar9 = source[9];
      uVar10 = source[10];
      uVar11 = source[0xb];
      uVar12 = source[0xc];
      uVar13 = source[0xd];
      uVar14 = source[0xe];
      uVar15 = source[0xf];
      puVar34 = source + uVar32;
      uVar16 = *puVar34;
      uVar17 = puVar34[1];
      uVar18 = puVar34[2];
      uVar19 = puVar34[3];
      uVar20 = puVar34[4];
      uVar21 = puVar34[5];
      uVar22 = puVar34[6];
      uVar23 = puVar34[7];
      uVar24 = puVar34[8];
      uVar25 = puVar34[9];
      uVar26 = puVar34[10];
      uVar27 = puVar34[0xb];
      uVar28 = puVar34[0xc];
      uVar29 = puVar34[0xd];
      uVar30 = puVar34[0xe];
      uVar31 = puVar34[0xf];
      source = source + 0x10;
      *out = uVar36;
      out[1] = uVar16;
      out[2] = uVar1;
      out[3] = uVar17;
      out[4] = uVar2;
      out[5] = uVar18;
      out[6] = uVar3;
      out[7] = uVar19;
      out[8] = uVar4;
      out[9] = uVar20;
      out[10] = uVar5;
      out[0xb] = uVar21;
      out[0xc] = uVar6;
      out[0xd] = uVar22;
      out[0xe] = uVar7;
      out[0xf] = uVar23;
      out[0x10] = uVar8;
      out[0x11] = uVar24;
      out[0x12] = uVar9;
      out[0x13] = uVar25;
      out[0x14] = uVar10;
      out[0x15] = uVar26;
      out[0x16] = uVar11;
      out[0x17] = uVar27;
      out[0x18] = uVar12;
      out[0x19] = uVar28;
      out[0x1a] = uVar13;
      out[0x1b] = uVar29;
      out[0x1c] = uVar14;
      out[0x1d] = uVar30;
      out[0x1e] = uVar15;
      out[0x1f] = uVar31;
      out = out + 0x20;
      uVar35 = uVar35 - 1;
    } while (uVar35 != 0);
  }
  uVar35 = count & 0xffffffffffffffe0;
  puVar34 = source + uVar32;
  if (uVar35 != count) {
    do {
      uVar32 = (ulong)((uint)uVar35 & 1);
      puVar33 = puVar34;
      if (uVar32 == 0) {
        puVar33 = source;
      }
      *out = *puVar33;
      out = out + 1;
      uVar35 = uVar35 + 1;
      puVar34 = puVar34 + uVar32;
      source = source + (uVar32 ^ 1);
    } while (uVar35 < count);
  }
  return;
}

Assistant:

static void
reconstruct (uint8_t* buf, uint64_t sz)
{
    uint8_t* t    = buf + 1;
    uint8_t* stop = buf + sz;
    while (t < stop)
    {
        int d = (int) (t[-1]) + (int) (t[0]) - 128;
        t[0]  = (uint8_t) d;
        ++t;
    }
}